

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall
soul::heart::Parser::scanTopLevelItem
          (Parser *this,CodeLocation *moduleLocation,
          vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
          *scannedTopLevelItems,Module *newModule)

{
  ScannedTopLevelItem newItem;
  string local_1c0;
  string local_1a0;
  TokenisedPathString local_180;
  ScannedTopLevelItem local_c8;
  
  local_c8.module = newModule;
  memset(&local_c8.moduleStartPos,0,0x98);
  (this->module).object = newModule;
  CodeLocation::operator=(&newModule->location,moduleLocation);
  readQualifiedGeneralIdentifier_abi_cxx11_(&local_180.fullPath,this);
  std::__cxx11::string::operator=((string *)&newModule->fullName,(string *)&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::_M_assign((string *)&newModule->originalFullName);
  std::__cxx11::string::string((string *)&local_1c0,(string *)&newModule->fullName);
  TokenisedPathString::TokenisedPathString(&local_180,&local_1c0);
  TokenisedPathString::getLastPart_abi_cxx11_(&local_1a0,&local_180);
  std::__cxx11::string::operator=((string *)&newModule->shortName,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  TokenisedPathString::~TokenisedPathString(&local_180);
  std::__cxx11::string::~string((string *)&local_1c0);
  parseAnnotation(this,&newModule->annotation);
  local_c8.moduleStartPos.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  scanTopLevelItems(this,&local_c8);
  std::
  vector<soul::heart::Parser::ScannedTopLevelItem,_std::allocator<soul::heart::Parser::ScannedTopLevelItem>_>
  ::emplace_back<soul::heart::Parser::ScannedTopLevelItem>(scannedTopLevelItems,&local_c8);
  ScannedTopLevelItem::~ScannedTopLevelItem(&local_c8);
  return;
}

Assistant:

void scanTopLevelItem (const CodeLocation& moduleLocation, std::vector<ScannedTopLevelItem>& scannedTopLevelItems, Module& newModule)
    {
        ScannedTopLevelItem newItem (newModule);
        module = newModule;

        newModule.location = moduleLocation;
        newModule.fullName = readQualifiedGeneralIdentifier();
        newModule.originalFullName = newModule.fullName;
        newModule.shortName = TokenisedPathString (newModule.fullName).getLastPart();
        parseAnnotation (newModule.annotation);
        newItem.moduleStartPos = getCurrentTokeniserPosition();
        scanTopLevelItems (newItem);
        scannedTopLevelItems.push_back (std::move (newItem));
    }